

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

double fas154_seas(double *b,int pq,void *params)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  double __ptr;
  double *A;
  int iVar5;
  ulong uVar6;
  int ip;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  double *pdVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  double extraout_XMM0_Qa;
  double local_b8;
  double sumlog;
  ulong local_a8;
  ulong local_a0;
  double local_98;
  double ssq;
  long local_88;
  double *local_80;
  int local_74;
  int local_70;
  int nit;
  int iter;
  double *local_60;
  double *local_58;
  long local_50;
  double *local_48;
  size_t local_40;
  double local_38;
  
  local_b8 = 0.0;
  local_98 = 0.0;
  uVar1 = *params;
  _iter = (long)(int)uVar1;
  iVar2 = *(int *)((long)params + 0xc);
  lVar13 = (long)iVar2;
  uVar3 = *(uint *)((long)params + 8);
  local_a0 = (ulong)*(uint *)((long)params + 0x10);
  local_38 = (double)(ulong)*(uint *)((long)params + 0x18);
  iVar10 = *(int *)((long)params + 0x1c);
  local_50 = (long)iVar10;
  local_a8 = (ulong)*(uint *)((long)params + 0x28);
  local_88 = (long)*(int *)((long)params + 0x50);
  local_40 = local_50 * 8;
  sumlog = (double)params;
  local_48 = (double *)malloc(local_40);
  local_58 = (double *)malloc(local_40);
  local_80 = (double *)malloc(local_40);
  sVar11 = (long)(((iVar10 + 1) * iVar10) / 2) << 3;
  local_60 = (double *)malloc(sVar11);
  ssq = (double)malloc(sVar11);
  sVar11 = local_40;
  if (0 < local_50) {
    memset(local_48,0,local_40);
    memset(local_58,0,sVar11);
  }
  if (0 < iter) {
    memcpy(local_48,b,(ulong)uVar1 * 8);
  }
  pdVar12 = b + _iter;
  if (0 < (int)uVar3) {
    memcpy(local_58,pdVar12,(ulong)uVar3 * 8);
  }
  A = local_80;
  dVar4 = sumlog;
  iVar10 = (int)local_a0;
  if (0 < iVar10) {
    uVar6 = 0;
    pdVar8 = local_48;
    do {
      pdVar8 = pdVar8 + lVar13;
      dVar15 = b[(long)(int)(uVar1 + uVar3) + uVar6];
      uVar6 = uVar6 + 1;
      local_48[uVar6 * lVar13 + -1] = local_48[uVar6 * lVar13 + -1] + dVar15;
      if (0 < (int)uVar1) {
        uVar7 = 0;
        do {
          pdVar8[uVar7] = pdVar8[uVar7] - b[uVar7] * dVar15;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
    } while (uVar6 != local_a0);
  }
  nit = iVar10 * iVar2;
  iVar5 = SUB84(local_38,0);
  iVar9 = (int)local_a8;
  local_40 = (size_t)iVar9;
  if (0 < iVar5) {
    uVar6 = 0;
    pdVar8 = local_58;
    do {
      pdVar8 = pdVar8 + lVar13;
      dVar15 = b[(long)(int)(uVar1 + uVar3 + iVar10) + uVar6];
      uVar6 = uVar6 + 1;
      local_58[uVar6 * lVar13 + -1] = local_58[uVar6 * lVar13 + -1] + dVar15;
      if (0 < (int)uVar3) {
        uVar7 = 0;
        do {
          pdVar8[uVar7] = pdVar12[uVar7] * dVar15 + pdVar8[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
    } while ((double)uVar6 != local_38);
  }
  ip = nit + iter;
  iVar2 = iVar5 * iVar2 + uVar3;
  local_50 = CONCAT44(local_50._4_4_,iVar2);
  if (0 < iVar9 && *(int *)((long)sumlog + 0x2c) == 1) {
    uVar6 = 0;
    do {
      *(double *)((long)sumlog + local_88 * 8 + 0x58 + uVar6 * 8) =
           *(double *)((long)sumlog + (local_88 + (long)iVar9 * 2) * 8 + 0x58 + uVar6 * 8) -
           b[(int)(iVar10 + iVar5 + uVar1 + uVar3)];
      uVar6 = uVar6 + 1;
    } while (local_a8 != uVar6);
  }
  bVar14 = ip != 1 || iVar2 != 0;
  if (bVar14) {
    starma(ip,iVar2,local_48,local_58,local_80,local_60,(double *)ssq);
    dVar15 = extraout_XMM0_Qa;
  }
  else {
    *(undefined8 *)ssq = 0x3ff0000000000000;
    *local_80 = 0.0;
    dVar15 = *local_48 * *local_48;
    *local_60 = 1.0 / (1.0 - dVar15);
  }
  pdVar12 = local_60;
  __ptr = ssq;
  local_38 = (double)(ulong)bVar14;
  local_74 = 0;
  karma(ip,iVar2,local_48,&local_98,A,local_60,(double *)ssq,(int)local_40,
        (double *)((long)dVar4 + local_88 * 8 + 0x58),
        (double *)((long)dVar4 + local_88 * 8 + local_40 * 8 + 0x58),&local_b8,&local_98,
        (uint)bVar14,dVar15,&local_70,&local_74);
  *(double *)((long)dVar4 + 0x40) = local_98;
  local_38 = local_b8 / (double)local_70;
  dVar15 = log(local_98 / (double)local_70);
  local_38 = (dVar15 + local_38) * 0.5;
  *(double *)((long)dVar4 + 0x48) = local_38;
  free(local_48);
  free(local_58);
  free(A);
  free(pdVar12);
  free((void *)__ptr);
  return local_38;
}

Assistant:

double fas154_seas(double *b, int pq, void *params) {
	double value, ssq, sumlog, delta;
	int p, q, ps, qs,s,offset;
	int ip, iq, ir, i,j, np, ifault, N, iupd, nit, iter;
	double *phi, *theta, *A, *P, *V;

	value = ssq = sumlog = 0.0;
	alik_seas_object obj = (alik_seas_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);
	ir = obj->r;
	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	offset = obj->offset;
	np = (ir * (ir + 1)) / 2;

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);

	for (i = 0; i < ir; ++i) {
		phi[i] = 0.0;
		theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}
	/*
	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}
	*/

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset + i] = obj->x[offset + 2 * N + i] - b[p + q + ps + qs];
		}
	}
	
	//mdisplay(phi, 1, ir);
	//mdisplay(theta, 1, ir);
	iupd = 0;
	//mdisplay(b, 1, pq);

	if (ip == 1 && iq == 0) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}

	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x + offset, obj->x + offset + N, &sumlog, &ssq, iupd, delta, &iter, &nit);
	obj->ssq = ssq;
	//mdisplay(V, 1, np);

	value = 0.5 * (sumlog / (double)iter + log(ssq / (double)iter));
	obj->loglik = value;
	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	return value;
}